

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_glfw.cpp
# Opt level: O0

void ImGui_ImplGlfw_UpdateMouseCursor(void)

{
  int iVar1;
  ImGuiMouseCursor IVar2;
  ImGuiIO *pIVar3;
  ImGuiMouseCursor imgui_cursor;
  ImGuiIO *io;
  undefined8 in_stack_ffffffffffffffe0;
  GLFWwindow *in_stack_ffffffffffffffe8;
  GLFWwindow *pGVar4;
  undefined4 in_stack_fffffffffffffff0;
  
  pIVar3 = ImGui::GetIO();
  if (((pIVar3->ConfigFlags & 0x20U) == 0) &&
     (iVar1 = glfwGetInputMode(in_stack_ffffffffffffffe8,
                               (int)((ulong)in_stack_ffffffffffffffe0 >> 0x20)), iVar1 != 0x34003))
  {
    IVar2 = ImGui::GetMouseCursor();
    if ((IVar2 == -1) || ((pIVar3->MouseDrawCursor & 1U) != 0)) {
      glfwSetInputMode((GLFWwindow *)CONCAT44(IVar2,in_stack_fffffffffffffff0),
                       (int)((ulong)in_stack_ffffffffffffffe8 >> 0x20),
                       (int)in_stack_ffffffffffffffe8);
    }
    else {
      pGVar4 = g_Window;
      glfwSetCursor((GLFWwindow *)CONCAT44(IVar2,in_stack_fffffffffffffff0),(GLFWcursor *)g_Window);
      glfwSetInputMode((GLFWwindow *)CONCAT44(IVar2,in_stack_fffffffffffffff0),
                       (int)((ulong)pGVar4 >> 0x20),(int)pGVar4);
    }
  }
  return;
}

Assistant:

static void ImGui_ImplGlfw_UpdateMouseCursor()
{
    ImGuiIO& io = ImGui::GetIO();
    if ((io.ConfigFlags & ImGuiConfigFlags_NoMouseCursorChange) || glfwGetInputMode(g_Window, GLFW_CURSOR) == GLFW_CURSOR_DISABLED)
        return;

    ImGuiMouseCursor imgui_cursor = ImGui::GetMouseCursor();
    if (imgui_cursor == ImGuiMouseCursor_None || io.MouseDrawCursor)
    {
        // Hide OS mouse cursor if imgui is drawing it or if it wants no cursor
        glfwSetInputMode(g_Window, GLFW_CURSOR, GLFW_CURSOR_HIDDEN);
    }
    else
    {
        // Show OS mouse cursor
        // FIXME-PLATFORM: Unfocused windows seems to fail changing the mouse cursor with GLFW 3.2, but 3.3 works here.
        glfwSetCursor(g_Window, g_MouseCursors[imgui_cursor] ? g_MouseCursors[imgui_cursor] : g_MouseCursors[ImGuiMouseCursor_Arrow]);
        glfwSetInputMode(g_Window, GLFW_CURSOR, GLFW_CURSOR_NORMAL);
    }
}